

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O0

void __thiscall
TaprootUtil_ParseAndVerifyTapScriptParityBit_Test::TestBody
          (TaprootUtil_ParseAndVerifyTapScriptParityBit_Test *this)

{
  uint8_t tapleaf_bit;
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  size_type sVar4;
  reference pvVar5;
  reference this_00;
  pointer *nodes_00;
  pointer *tapscript_00;
  string local_530;
  AssertHelper local_510;
  Message local_508;
  allocator local_4f9;
  string local_4f8;
  SchnorrPubkey local_4d8;
  bool local_4b9;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_488;
  Message local_480;
  bool local_471;
  undefined1 local_470 [8];
  AssertionResult gtest_ar__1;
  Message local_458;
  string local_450;
  undefined1 local_430 [8];
  AssertionResult gtest_ar_8;
  Message local_418;
  size_type local_410;
  int local_404;
  undefined1 local_400 [8];
  AssertionResult gtest_ar_7;
  Message local_3e8;
  string local_3e0;
  undefined1 local_3c0 [8];
  AssertionResult gtest_ar_6;
  Message local_3a8;
  string local_3a0;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_5;
  Message local_368;
  string local_360;
  undefined1 local_340 [8];
  AssertionResult gtest_ar_4;
  Message local_328;
  size_type local_320;
  int local_314;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_3;
  Message local_2f8;
  string local_2f0;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_2;
  Message local_2b8;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_298 [7];
  uint8_t ver;
  AssertHelper local_278;
  Message local_270;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_;
  Message local_250;
  string local_248;
  undefined1 local_228 [8];
  AssertionResult gtest_ar;
  ByteData annex;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> script_stack;
  Script tapscript;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  SchnorrPubkey pk;
  undefined1 local_178 [6];
  uint8_t tapleaf_flag;
  bool parity;
  SchnorrSignature sig;
  ScriptWitness local_c0;
  undefined1 local_a0 [8];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> stack;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  Transaction tx2;
  TaprootUtil_ParseAndVerifyTapScriptParityBit_Test *this_local;
  
  tx2.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,
             "020000000001010513391eb3cb6529b86485dbee924a070a7e556c084ed6f0ff338d7a80335c450000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5700000000"
             ,&local_71);
  cfd::core::Transaction::Transaction((Transaction *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  cfd::core::Transaction::GetTxIn
            ((TxInReference *)&sig.sighash_type_.is_anyone_can_pay_,(Transaction *)local_50,0);
  cfd::core::AbstractTxInReference::GetScriptWitness
            (&local_c0,(AbstractTxInReference *)&sig.sighash_type_.is_anyone_can_pay_);
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_a0,&local_c0
            );
  cfd::core::ScriptWitness::~ScriptWitness(&local_c0);
  cfd::core::TxInReference::~TxInReference((TxInReference *)&sig.sighash_type_.is_anyone_can_pay_);
  cfd::core::SchnorrSignature::SchnorrSignature((SchnorrSignature *)local_178);
  pk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  pk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = '\0';
  cfd::core::SchnorrPubkey::SchnorrPubkey
            ((SchnorrPubkey *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &tapscript.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script
            ((Script *)
             &script_stack.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &annex.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::ByteData((ByteData *)&gtest_ar.message_);
  nodes_00 = &tapscript.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cfd::core::TaprootUtil::ParseTaprootSignData
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_a0,
             (SchnorrSignature *)local_178,
             (bool *)((long)&pk.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7),
             (uint8_t *)
             ((long)&pk.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 6),
             (SchnorrPubkey *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)nodes_00,
             (Script *)
             &script_stack.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &annex.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData *)&gtest_ar.message_);
  cfd::core::SchnorrSignature::GetHex_abi_cxx11_(&local_248,(SchnorrSignature *)local_178,false);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_228,"\"\"","sig.GetHex()",(char (*) [1])0x8af3ea,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar2) {
    testing::Message::Message(&local_250);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1b2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_268,
             (bool *)((long)&pk.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7),(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar2) {
    testing::Message::Message(&local_270);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_298,(internal *)local_268,(AssertionResult *)0x6e33c4,"false","true",
               (char *)nodes_00);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1b3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_278,&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    std::__cxx11::string::~string((string *)local_298);
    testing::Message::~Message(&local_270);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  gtest_ar_1.message_.ptr_._7_1_ = 0xc0;
  testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
            ((EqHelper<false> *)local_2b0,"ver","tapleaf_flag",
             (uchar *)((long)&gtest_ar_1.message_.ptr_ + 7),
             (uchar *)((long)&pk.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar2) {
    testing::Message::Message(&local_2b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1b5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_
            (&local_2f0,
             (SchnorrPubkey *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_2d0,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"","pk.GetHex()",
             (char (*) [65])0x722a65,&local_2f0);
  std::__cxx11::string::~string((string *)&local_2f0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
  if (!bVar2) {
    testing::Message::Message(&local_2f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1b6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_2f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
  local_314 = 2;
  local_320 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                        ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                         &tapscript.script_stack_.
                          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_310,"2","nodes.size()",&local_314,&local_320);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_310);
  if (!bVar2) {
    testing::Message::Message(&local_328);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1b7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_328);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
  sVar4 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                    ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                     &tapscript.script_stack_.
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar4 == 2) {
    pvVar5 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
             operator[]((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                        &tapscript.script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    cfd::core::ByteData256::GetHex_abi_cxx11_(&local_360,pvVar5);
    testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
              ((EqHelper<false> *)local_340,
               "\"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d\"",
               "nodes[0].GetHex()",(char (*) [65])0x6e89dc,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_340);
    if (!bVar2) {
      testing::Message::Message(&local_368);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_340);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
                 ,0x1ba,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_368);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_368);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_340);
    pvVar5 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
             operator[]((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                        &tapscript.script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
    cfd::core::ByteData256::GetHex_abi_cxx11_(&local_3a0,pvVar5);
    testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
              ((EqHelper<false> *)local_380,
               "\"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57\"",
               "nodes[1].GetHex()",
               (char (*) [65])"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57",
               &local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
    if (!bVar2) {
      testing::Message::Message(&local_3a8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
                 ,0x1bc,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_3a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_3a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  }
  cfd::core::Script::GetHex_abi_cxx11_
            (&local_3e0,
             (Script *)
             &script_stack.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_3c0,
             "\"201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac\"",
             "tapscript.GetHex()",
             (char (*) [69])"201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
             &local_3e0);
  std::__cxx11::string::~string((string *)&local_3e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c0);
  if (!bVar2) {
    testing::Message::Message(&local_3e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1bf,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_3e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_3e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c0);
  local_404 = 1;
  local_410 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         &annex.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_400,"1","script_stack.size()",&local_404,&local_410);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_400);
  if (!bVar2) {
    testing::Message::Message(&local_418);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_400);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1c0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_400);
  sVar4 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                     &annex.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar4 == 1) {
    this_00 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         &annex.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_450,this_00);
    testing::internal::EqHelper<false>::Compare<char[131],std::__cxx11::string>
              ((EqHelper<false> *)local_430,
               "\"bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e001\""
               ,"script_stack[0].GetHex()",
               (char (*) [131])
               "bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e001"
               ,&local_450);
    std::__cxx11::string::~string((string *)&local_450);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_430);
    if (!bVar2) {
      testing::Message::Message(&local_458);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_430);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
                 ,0x1c4,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_458);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_458);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_430);
  }
  local_471 = cfd::core::ByteData::IsEmpty((ByteData *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_470,&local_471,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
  if (!bVar2) {
    testing::Message::Message(&local_480);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_470,
               (AssertionResult *)"annex.IsEmpty()","false","true",(char *)nodes_00);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1c6,pcVar3);
    testing::internal::AssertHelper::operator=(&local_488,&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_480);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
  bVar1 = pk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_;
  tapleaf_bit = pk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4f8,"262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad40165"
             ,&local_4f9);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_4d8,&local_4f8);
  tapscript_00 = &script_stack.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_4b9 = cfd::core::TaprootUtil::VerifyTaprootCommitment
                        ((bool)(bVar1 & 1),tapleaf_bit,&local_4d8,
                         (SchnorrPubkey *)
                         &nodes.
                          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                         &tapscript.script_stack_.
                          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)tapscript_00,
                         (ByteData256 *)0x0,kMainnet);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4b8,&local_4b9,(type *)0x0);
  cfd::core::SchnorrPubkey::~SchnorrPubkey(&local_4d8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
  if (!bVar2) {
    testing::Message::Message(&local_508);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_530,(internal *)local_4b8,
               (AssertionResult *)
               "TaprootUtil::VerifyTaprootCommitment( parity, tapleaf_flag, SchnorrPubkey(\"262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad40165\"), pk, nodes, tapscript)"
               ,"false","true",(char *)tapscript_00);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_510,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1cb,pcVar3);
    testing::internal::AssertHelper::operator=(&local_510,&local_508);
    testing::internal::AssertHelper::~AssertHelper(&local_510);
    std::__cxx11::string::~string((string *)&local_530);
    testing::Message::~Message(&local_508);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar.message_);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &annex.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::~Script
            ((Script *)
             &script_stack.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &tapscript.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)local_178);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_a0);
  cfd::core::Transaction::~Transaction((Transaction *)local_50);
  return;
}

Assistant:

TEST(TaprootUtil, ParseAndVerifyTapScriptParityBit) {
  Transaction tx2("020000000001010513391eb3cb6529b86485dbee924a070a7e556c084ed6f0ff338d7a80335c450000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e00122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c11777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5700000000");
  auto stack = tx2.GetTxIn(0).GetScriptWitness().GetWitness();
  SchnorrSignature sig;
  bool parity = false;
  uint8_t tapleaf_flag = 0;
  SchnorrPubkey pk;
  std::vector<ByteData256> nodes;
  Script tapscript;
  std::vector<ByteData> script_stack;
  ByteData annex;
  TaprootUtil::ParseTaprootSignData(stack, &sig, &parity, &tapleaf_flag,
      &pk, &nodes, &tapscript, &script_stack, &annex);
  EXPECT_EQ("", sig.GetHex());
  EXPECT_TRUE(parity);
  uint8_t ver = TaprootScriptTree::kTapScriptLeafVersion;
  EXPECT_EQ(ver, tapleaf_flag);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb", pk.GetHex());
  EXPECT_EQ(2, nodes.size());
  if (nodes.size() == 2) {
    EXPECT_EQ("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
        nodes[0].GetHex());
    EXPECT_EQ("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d57",
        nodes[1].GetHex());
  }
  EXPECT_EQ("201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
      tapscript.GetHex());
  EXPECT_EQ(1, script_stack.size());
  if (script_stack.size() == 1) {
    EXPECT_EQ(
        "bf55a5d15cc7dd2b583f571db0d59be9b1838a81191ad0e057caf9670d1b7de599864d6bd5e68bd56bb6da4d44e1dfd2deec3a03792c066613c4f6560d4876e001",
        script_stack[0].GetHex());
  }
  EXPECT_TRUE(annex.IsEmpty());

  EXPECT_TRUE(TaprootUtil::VerifyTaprootCommitment(
      parity, tapleaf_flag,
      SchnorrPubkey("262d16c95b41f6a90a360837b5e9c3e213334deacffaec0413f8b6e98ad40165"),
      pk, nodes, tapscript));
}